

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O3

RPCHelpMan * decoderawtransaction(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  Fallback fallback_00;
  RPCExamples examples;
  string description_01;
  string description_02;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  RPCHelpMan *in_RDI;
  undefined8 uVar6;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  code *pcVar8;
  undefined8 in_stack_fffffffffffff940;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff948;
  _Vector_impl_data in_stack_fffffffffffff958;
  _Vector_impl_data in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff988 [16];
  pointer in_stack_fffffffffffff998;
  _Alloc_hider in_stack_fffffffffffff9a0;
  _Alloc_hider _Var9;
  size_type in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  _Alloc_hider in_stack_fffffffffffff9c0;
  _Alloc_hider _Var10;
  size_type in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  _Alloc_hider in_stack_fffffffffffff9e0;
  size_type in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  string local_600;
  string local_5e0;
  string local_5c0;
  ulong *local_5a0;
  undefined8 local_598;
  ulong local_590;
  undefined8 uStack_588;
  ulong *local_580;
  size_type local_578;
  ulong local_570;
  undefined8 uStack_568;
  string local_560;
  long *local_540 [2];
  long local_530 [2];
  long *local_520 [2];
  long local_510 [2];
  RPCResult local_500;
  undefined1 local_478;
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460;
  undefined7 uStack_45f;
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  uint *local_410;
  undefined8 local_408;
  uint local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  undefined1 local_398;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"decoderawtransaction","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "Return a JSON object representing the serialized, hex-encoded transaction.","");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"hexstring","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"The transaction hex string","");
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_370 = 0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_2_ = 0;
  local_348._10_6_ = 0;
  local_348._16_2_ = 0;
  local_348._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff928;
  name.field_2._8_8_ = in_stack_fffffffffffff930;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff940;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff938;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff948;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff958._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff958._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff958._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff970._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff970._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff970._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff988;
  description_01._M_string_length = (size_type)in_stack_fffffffffffff9a0._M_p;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff998;
  description_01.field_2._M_allocated_capacity = in_stack_fffffffffffff9a8;
  description_01.field_2._8_8_ = in_stack_fffffffffffff9b0;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff9c0._M_p;
  opts._0_8_ = in_stack_fffffffffffff9b8;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff9c8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff9d0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff9d8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9e0._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff9e8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff9f0;
  opts.hidden = (bool)(char)in_stack_fffffffffffff9f8;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff9f8 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffff9f8 >> 0x10);
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_01,opts);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"iswitness","");
  local_410 = &local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_410,"depends on heuristic tests","");
  local_3f0._0_8_ = (long)&local_3f0 + 0x10;
  if (local_410 == &local_400) {
    local_3f0._24_4_ = uStack_3f8;
    local_3f0._28_4_ = uStack_3f4;
  }
  else {
    local_3f0._0_8_ = local_410;
  }
  local_3f0._8_8_ = local_408;
  local_408 = 0;
  local_400 = local_400 & 0xffffff00;
  local_398 = 1;
  local_430[0] = local_420;
  local_410 = &local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_430,
             "Whether the transaction hex is a serialized witness transaction.\nIf iswitness is not present, heuristic tests will be used in decoding.\nIf true, only witness deserialization will be tried.\nIf false, only non-witness deserialization will be tried.\nThis boolean should reflect whether the transaction has inputs\n(e.g. fully valid, or on-chain transactions), if known by the caller."
             ,"");
  local_470 = &local_460;
  local_478 = 0;
  local_468 = 0;
  local_460 = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff928;
  name_00.field_2._8_8_ = in_stack_fffffffffffff930;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff940;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff938;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff948;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff958._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff958._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff958._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff970._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff970._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff970._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff988;
  description_02._M_string_length = (size_type)in_stack_fffffffffffff9a0._M_p;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff998;
  description_02.field_2._M_allocated_capacity = in_stack_fffffffffffff9a8;
  description_02.field_2._8_8_ = in_stack_fffffffffffff9b0;
  opts_00.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff9c0._M_p;
  opts_00._0_8_ = in_stack_fffffffffffff9b8;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff9c8;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff9d0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff9d8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9e0._M_p;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff9e8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff9f0;
  opts_00.hidden = (bool)(char)in_stack_fffffffffffff9f8;
  opts_00.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff9f8 >> 8);
  opts_00._66_6_ = (int6)((ulong)in_stack_fffffffffffff9f8 >> 0x10);
  RPCArg::RPCArg(&local_180,name_00,(Type)local_390,fallback_00,description_02,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff988,__l,
             (allocator_type *)&stack0xfffffffffffff987);
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"");
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"The transaction id","");
  DecodeTxDoc((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff950,&local_560);
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff928;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff930;
  description._M_string_length = in_stack_fffffffffffff940;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff938;
  description.field_2 = in_stack_fffffffffffff948;
  RPCResult::RPCResult
            (&local_500,OBJ,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff958,
             SUB81(local_520,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff918;
  result.m_key_name._M_string_length = in_stack_fffffffffffff928;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff930;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff938;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff948;
  result._64_24_ = in_stack_fffffffffffff958;
  result._88_24_ = in_stack_fffffffffffff970;
  result.m_cond._8_16_ = in_stack_fffffffffffff988;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff998;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff968,result);
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"decoderawtransaction","");
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"\"hexstring\"","");
  HelpExampleCli(&local_5c0,&local_5e0,&local_600);
  _Var10._M_p = &stack0xfffffffffffff9d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff9c0,"decoderawtransaction","");
  _Var9._M_p = &stack0xfffffffffffff9b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff9a0,"\"hexstring\"","");
  HelpExampleRpc((string *)&stack0xfffffffffffff9e0,(string *)&stack0xfffffffffffff9c0,
                 (string *)&stack0xfffffffffffff9a0);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    uVar6 = local_5c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < in_stack_fffffffffffff9e8 + local_5c0._M_string_length) {
    uVar6 = 0xf;
    if (in_stack_fffffffffffff9e0._M_p != &stack0xfffffffffffff9f0) {
      uVar6 = in_stack_fffffffffffff9f0;
    }
    if (in_stack_fffffffffffff9e8 + local_5c0._M_string_length <= (ulong)uVar6) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffff9e0,0,0,local_5c0._M_dataplus._M_p,
                       local_5c0._M_string_length);
      goto LAB_0037c5b2;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_5c0,in_stack_fffffffffffff9e0._M_p,in_stack_fffffffffffff9e8);
LAB_0037c5b2:
  local_5a0 = &local_590;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_590 = paVar1->_M_allocated_capacity;
    uStack_588 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_590 = paVar1->_M_allocated_capacity;
    local_5a0 = puVar2;
  }
  local_578 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_5a0 == &local_590) {
    uStack_568 = uStack_588;
    local_580 = &local_570;
  }
  else {
    local_580 = local_5a0;
  }
  local_570 = local_590;
  local_598 = 0;
  local_590 = local_590 & 0xffffffffffffff00;
  pcVar8 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:479:9)>
           ::_M_manager;
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:479:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:479:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffff948;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff998;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff988._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff988._8_8_;
  examples.m_examples.field_2._8_8_ = _Var9._M_p;
  local_5a0 = &local_590;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff928)),description_00,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffff958,
             (RPCResults)in_stack_fffffffffffff970,examples,(RPCMethodImpl *)&local_58);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&stack0xfffffffffffff928,&stack0xfffffffffffff928,3);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580,local_570 + 1);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0,local_590 + 1);
  }
  if (in_stack_fffffffffffff9e0._M_p != &stack0xfffffffffffff9f0) {
    operator_delete(in_stack_fffffffffffff9e0._M_p,in_stack_fffffffffffff9f0 + 1);
  }
  if (_Var9._M_p != &stack0xfffffffffffff9b0) {
    operator_delete(_Var9._M_p,in_stack_fffffffffffff9b0 + 1);
  }
  if (_Var10._M_p != &stack0xfffffffffffff9d0) {
    operator_delete(_Var10._M_p,in_stack_fffffffffffff9d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff968);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500.m_cond._M_dataplus._M_p != &local_500.m_cond.field_2) {
    operator_delete(local_500.m_cond._M_dataplus._M_p,
                    local_500.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500.m_description._M_dataplus._M_p != &local_500.m_description.field_2) {
    operator_delete(local_500.m_description._M_dataplus._M_p,
                    local_500.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_500.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500.m_key_name._M_dataplus._M_p != &local_500.m_key_name.field_2) {
    operator_delete(local_500.m_key_name._M_dataplus._M_p,
                    local_500.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if (local_540[0] != local_530) {
    operator_delete(local_540[0],local_530[0] + 1);
  }
  if (local_520[0] != local_510) {
    operator_delete(local_520[0],local_510[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff988);
  lVar7 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar7));
    plVar3 = *(long **)((long)&local_308 + lVar7 + 0x40);
    plVar5 = (long *)((long)&local_308 + lVar7 + 0x50);
    if (plVar5 != plVar3) {
      operator_delete(plVar3,*plVar5 + 1);
    }
    plVar5 = (long *)((long)&local_308 + lVar7 + 0x28);
    plVar3 = *(long **)((long)&local_308 + lVar7 + 0x18);
    if (plVar5 != plVar3) {
      operator_delete(plVar3,*plVar5 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar7));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar7
               ));
    if ((long *)((long)local_380 + lVar7) != *(long **)((long)local_390 + lVar7)) {
      operator_delete(*(long **)((long)local_390 + lVar7),*(long *)((long)local_380 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x108;
  } while (lVar7 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470 != &local_460) {
    operator_delete(local_470,CONCAT71(uStack_45f,local_460) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3f0._M_first);
  if (local_410 != &local_400) {
    operator_delete(local_410,CONCAT44(uStack_3fc,local_400) + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan decoderawtransaction()
{
    return RPCHelpMan{"decoderawtransaction",
                "Return a JSON object representing the serialized, hex-encoded transaction.",
                {
                    {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction hex string"},
                    {"iswitness", RPCArg::Type::BOOL, RPCArg::DefaultHint{"depends on heuristic tests"}, "Whether the transaction hex is a serialized witness transaction.\n"
                        "If iswitness is not present, heuristic tests will be used in decoding.\n"
                        "If true, only witness deserialization will be tried.\n"
                        "If false, only non-witness deserialization will be tried.\n"
                        "This boolean should reflect whether the transaction has inputs\n"
                        "(e.g. fully valid, or on-chain transactions), if known by the caller."
                    },
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    DecodeTxDoc(/*txid_field_doc=*/"The transaction id"),
                },
                RPCExamples{
                    HelpExampleCli("decoderawtransaction", "\"hexstring\"")
            + HelpExampleRpc("decoderawtransaction", "\"hexstring\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    CMutableTransaction mtx;

    bool try_witness = request.params[1].isNull() ? true : request.params[1].get_bool();
    bool try_no_witness = request.params[1].isNull() ? true : !request.params[1].get_bool();

    if (!DecodeHexTx(mtx, request.params[0].get_str(), try_no_witness, try_witness)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "TX decode failed");
    }

    UniValue result(UniValue::VOBJ);
    TxToUniv(CTransaction(std::move(mtx)), /*block_hash=*/uint256(), /*entry=*/result, /*include_hex=*/false);

    return result;
},
    };
}